

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

Node * __thiscall
TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_>::NewKey
          (TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_> *this,FName *key)

{
  IPair IVar1;
  Node *pNVar2;
  Node *pNVar3;
  uint uVar4;
  Node *pNVar5;
  Node *pNVar6;
  FName local_1c;
  
  uVar4 = this->Size - 1 & key->Index;
  pNVar3 = this->Nodes + uVar4;
  if (this->Nodes[uVar4].Next != (Node *)0x1) {
    pNVar2 = GetFreePos(this);
    if (pNVar2 == (Node *)0x0) {
      Rehash(this);
      local_1c = (FName)key->Index;
      pNVar3 = NewKey(this,&local_1c);
      return pNVar3;
    }
    pNVar6 = this->Nodes + (this->Size - 1 & (pNVar3->Pair).Key.Index);
    if (this->Nodes + (this->Size - 1 & (pNVar3->Pair).Key.Index) == pNVar3) {
      pNVar2->Next = pNVar3->Next;
      pNVar6 = pNVar2;
      goto LAB_00352fde;
    }
    do {
      pNVar5 = pNVar6;
      pNVar6 = pNVar5->Next;
    } while (pNVar6 != pNVar3);
    pNVar5->Next = pNVar2;
    IVar1 = pNVar3->Pair;
    pNVar2->Next = pNVar3->Next;
    pNVar2->Pair = IVar1;
  }
  pNVar2 = (Node *)0x0;
  pNVar6 = pNVar3;
LAB_00352fde:
  pNVar3->Next = pNVar2;
  this->NumUsed = this->NumUsed + 1;
  (pNVar6->Pair).Key.Index = key->Index;
  return pNVar6;
}

Assistant:

Node *NewKey(const KT key)
	{
		Node *mp = MainPosition(key);
		if (!mp->IsNil())
		{
			Node *othern;
			Node *n = GetFreePos();		/* get a free place */
			if (n == NULL)				/* cannot find a free place? */
			{
				Rehash();				/* grow table */
				return NewKey(key);		/* re-insert key into grown table */
			}
			othern = MainPosition(mp->Pair.Key);
			if (othern != mp)			/* is colliding node out of its main position? */
			{	/* yes; move colliding node into free position */
				while (othern->Next != mp)	/* find previous */
				{
					othern = othern->Next;
				}
				othern->Next = n;		/* redo the chain with 'n' in place of 'mp' */
				CopyNode(n, mp); /* copy colliding node into free pos. (mp->Next also goes) */
				mp->Next = NULL;		/* now 'mp' is free */
			}
			else						/* colliding node is in its own main position */
			{							/* new node will go into free position */
				n->Next = mp->Next;		/* chain new position */
				mp->Next = n;
				mp = n;
			}
		}
		else
		{
			mp->Next = NULL;
		}
		++NumUsed;
		::new(&mp->Pair.Key) KT(key);
		return mp;
	}